

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameParseCleanup(Parse *pParse)

{
  sqlite3 *db;
  Index *p;
  RenameToken *pRVar1;
  RenameToken *p_00;
  
  db = pParse->db;
  if (pParse->pVdbe != (Vdbe *)0x0) {
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db,pParse->pNewTable);
  while (p = pParse->pNewIndex, p != (Index *)0x0) {
    pParse->pNewIndex = p->pNext;
    sqlite3FreeIndex(db,p);
  }
  sqlite3DeleteTrigger(db,pParse->pNewTrigger);
  if (pParse->zErrMsg != (char *)0x0) {
    sqlite3DbFreeNN(db,pParse->zErrMsg);
  }
  p_00 = pParse->pRename;
  while (p_00 != (RenameToken *)0x0) {
    pRVar1 = p_00->pNext;
    sqlite3DbFreeNN(db,p_00);
    p_00 = pRVar1;
  }
  sqlite3ParseObjectReset(pParse);
  return;
}

Assistant:

static void renameParseCleanup(Parse *pParse){
  sqlite3 *db = pParse->db;
  Index *pIdx;
  if( pParse->pVdbe ){
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db, pParse->pNewTable);
  while( (pIdx = pParse->pNewIndex)!=0 ){
    pParse->pNewIndex = pIdx->pNext;
    sqlite3FreeIndex(db, pIdx);
  }
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->zErrMsg);
  renameTokenFree(db, pParse->pRename);
  sqlite3ParseObjectReset(pParse);
}